

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O1

void duckdb::QuantileListOperation<duckdb::timestamp_t,false>::
     Window<duckdb::QuantileState<duckdb::date_t,duckdb::QuantileStandardType>,duckdb::date_t,duckdb::list_entry_t>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *list,idx_t lidx
               )

{
  ulong *puVar1;
  ValidityMask *pVVar2;
  QuantileBindData *bind_data;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  CursorType *data;
  idx_t n;
  pointer pWVar6;
  type this_00;
  WindowQuantileState<duckdb::date_t> *this_01;
  TemplatedValidityData<unsigned_long> *pTVar7;
  QuantileIncluded<duckdb::date_t> included;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  QuantileIncluded<duckdb::date_t> local_48;
  idx_t local_38;
  
  data = QuantileState<duckdb::date_t,_duckdb::QuantileStandardType>::GetOrCreateWindowCursor
                   ((QuantileState<duckdb::date_t,_duckdb::QuantileStandardType> *)l_state,partition
                   );
  pVVar2 = partition->filter_mask;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&aggr_input_data->bind_data);
  bind_data = (QuantileBindData *)(aggr_input_data->bind_data).ptr;
  local_48.fmask = pVVar2;
  local_48.dmask = data;
  n = QuantileOperation::FrameSize<duckdb::date_t>(&local_48,frames);
  if (n == 0) {
    FlatVector::VerifyFlatVector(list);
    if ((list->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      local_38 = (list->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_58,&local_38);
      p_Var5 = p_Stack_50;
      peVar4 = local_58;
      local_58 = (element_type *)0x0;
      p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (list->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (list->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar4;
      (list->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var5;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
      }
      pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(list->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         );
      (list->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)
           (pTVar7->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    bVar3 = (byte)lidx & 0x3f;
    puVar1 = (list->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask + (lidx >> 6)
    ;
    *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
  }
  else {
    if ((g_state != (const_data_ptr_t)0x0) && (*(long *)(g_state + 0x18) != 0)) {
      pWVar6 = unique_ptr<duckdb::WindowQuantileState<duckdb::date_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::date_t>_>,_true>
               ::operator->((unique_ptr<duckdb::WindowQuantileState<duckdb::date_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::date_t>_>,_true>
                             *)(g_state + 0x18));
      if ((QuantileSortTree *)
          (pWVar6->qst).
          super_unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>
          .super__Head_base<0UL,_duckdb::QuantileSortTree_*,_false> != (QuantileSortTree *)0x0) {
        this_00 = unique_ptr<duckdb::WindowQuantileState<duckdb::date_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::date_t>_>,_true>
                  ::operator*((unique_ptr<duckdb::WindowQuantileState<duckdb::date_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::date_t>_>,_true>
                               *)(g_state + 0x18));
        WindowQuantileState<duckdb::date_t>::WindowList<duckdb::timestamp_t,false>
                  (this_00,data,frames,n,list,lidx,bind_data);
        return;
      }
    }
    this_01 = QuantileState<duckdb::date_t,_duckdb::QuantileStandardType>::GetOrCreateWindowState
                        ((QuantileState<duckdb::date_t,_duckdb::QuantileStandardType> *)l_state);
    WindowQuantileState<duckdb::date_t>::UpdateSkip(this_01,data,frames,&local_48);
    WindowQuantileState<duckdb::date_t>::WindowList<duckdb::timestamp_t,false>
              (this_01,data,frames,n,list,lidx,bind_data);
    ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::operator=
              (&(this_01->prevs).
                super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>,
               &frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>);
  }
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &list,
	                   idx_t lidx) {
		auto &state = *reinterpret_cast<STATE *>(l_state);
		auto gstate = reinterpret_cast<const STATE *>(g_state);

		auto &data = state.GetOrCreateWindowCursor(partition);
		const auto &fmask = partition.filter_mask;

		D_ASSERT(aggr_input_data.bind_data);
		auto &bind_data = aggr_input_data.bind_data->Cast<QuantileBindData>();

		QuantileIncluded<INPUT_TYPE> included(fmask, data);
		const auto n = FrameSize(included, frames);

		// Result is a constant LIST<RESULT_TYPE> with a fixed length
		if (!n) {
			auto &lmask = FlatVector::Validity(list);
			lmask.Set(lidx, false);
			return;
		}

		if (gstate && gstate->HasTree()) {
			gstate->GetWindowState().template WindowList<CHILD_TYPE, DISCRETE>(data, frames, n, list, lidx, bind_data);
		} else {
			auto &window_state = state.GetOrCreateWindowState();
			window_state.UpdateSkip(data, frames, included);
			window_state.template WindowList<CHILD_TYPE, DISCRETE>(data, frames, n, list, lidx, bind_data);
			window_state.prevs = frames;
		}
	}